

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Converter.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::
from_utf_nn<unsigned_short,convertUTF::ConversionResult(*)(unsigned_short_const**,unsigned_short_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vec,
          _func_ConversionResult_unsigned_short_ptr_ptr_unsigned_short_ptr_uchar_ptr_ptr_uchar_ptr_ConversionFlags
          *conversionFn)

{
  ConversionResult CVar1;
  undefined4 *puVar2;
  uint *local_1c0;
  undefined8 local_1b8;
  uint local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  UTF8 *targetStart_out;
  unsigned_short *sourceStart;
  ostringstream ss;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  sourceStart = *(unsigned_short **)this;
  targetStart_out = (UTF8 *)(__return_storage_ptr__->_M_dataplus)._M_p;
  CVar1 = convertUTF::ConvertUTF16toUTF8
                    (&sourceStart,*(UTF16 **)(this + 8),&targetStart_out,
                     targetStart_out + __return_storage_ptr__->_M_string_length,strictConversion);
  if (CVar1 == conversionOK) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::operator<<((ostream *)&ss,"Cannot convert string : invalid source text");
  puVar2 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar2 = 3;
  *(undefined4 **)(puVar2 + 2) = puVar2 + 6;
  if (local_1c0 == &local_1b0) {
    puVar2[6] = local_1b0;
    puVar2[7] = uStack_1ac;
    puVar2[8] = uStack_1a8;
    puVar2[9] = uStack_1a4;
  }
  else {
    *(uint **)(puVar2 + 2) = local_1c0;
    *(ulong *)(puVar2 + 6) = CONCAT44(uStack_1ac,local_1b0);
  }
  *(undefined8 *)(puVar2 + 4) = local_1b8;
  local_1b0 = local_1b0 & 0xffffff00;
  __cxa_throw(puVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

std::string from_utf_nn(std::vector<InputType> &&vec, F conversionFn)
{
    std::string rv;
    rv.resize(vec.size() * 4);
    const InputType *sourceStart = vec.data();
    auto sourceEnd = sourceStart + vec.size();
    const auto targetStart = reinterpret_cast<UTF8 *>(rv.data());
    auto targetStart_out = targetStart;
    auto targetEnd = targetStart + rv.size();
    auto result = conversionFn(&sourceStart, sourceEnd, &targetStart_out, targetEnd, ConversionFlags::strictConversion);
    if (result != ConversionResult::conversionOK)
    {
        THROW(ERR_COMMON, "Cannot convert string : invalid source text")
    }
    rv.resize(targetStart_out - targetStart);
    return rv;
}